

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_fillDoubleHashTable
               (ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
               ZSTD_tableFillPurpose_e tfp)

{
  long *plVar1;
  uint h;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  U32 *hashTable;
  U32 *pUVar5;
  BYTE *pBVar6;
  char cVar7;
  size_t sVar8;
  size_t sVar9;
  BYTE *pBVar10;
  ulong uVar11;
  U32 hBitsL;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int local_58;
  
  hashTable = ms->hashTable;
  h = (ms->cParams).hashLog;
  if (tfp == ZSTD_tfp_forCDict) {
    uVar2 = (ms->cParams).minMatch;
    pUVar5 = ms->chainTable;
    uVar3 = (ms->cParams).chainLog;
    UVar4 = uVar3 + 8;
    pBVar6 = (ms->window).base;
    uVar12 = (ulong)ms->nextToUpdate;
    cVar7 = (char)uVar3;
    pBVar10 = pBVar6 + uVar12;
    while (pBVar10 + 2 <= (BYTE *)((long)end - 8U)) {
      local_58 = (int)pBVar6;
      lVar14 = 0;
      uVar13 = uVar12;
      do {
        if (lVar14 == 3) break;
        if (0x20 < UVar4) {
LAB_001652ae:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        plVar1 = (long *)(pBVar10 + lVar14);
        switch(uVar2) {
        case 5:
          uVar11 = *plVar1 * -0x30e4432345000000;
          goto LAB_00165070;
        case 6:
          sVar8 = ZSTD_hash6Ptr(plVar1,UVar4);
          break;
        case 7:
          uVar11 = *plVar1 * -0x30e44323405a9d00;
LAB_00165070:
          sVar8 = uVar11 >> (0x38U - cVar7 & 0x3f);
          break;
        case 8:
          sVar8 = ZSTD_hash8Ptr(plVar1,UVar4);
          break;
        default:
          sVar8 = (size_t)((uint)((int)*plVar1 * -0x61c8864f) >> (0x18U - cVar7 & 0x1f));
        }
        if (0x20 < h + 8) goto LAB_001652ae;
        sVar9 = ZSTD_hash8Ptr(plVar1,h + 8);
        if (lVar14 == 0) {
          ZSTD_writeTaggedIndex(pUVar5,sVar8,(int)pBVar10 - local_58);
LAB_001650ef:
          ZSTD_writeTaggedIndex(hashTable,sVar9,(U32)uVar13);
        }
        else if (hashTable[sVar9 >> 8] == 0) goto LAB_001650ef;
        lVar14 = lVar14 + 1;
        uVar13 = (ulong)((U32)uVar13 + 1);
      } while (dtlm != ZSTD_dtlm_fast);
      uVar12 = (ulong)((int)uVar12 + 3);
      pBVar10 = pBVar10 + 3;
    }
  }
  else {
    uVar2 = (ms->cParams).minMatch;
    pUVar5 = ms->chainTable;
    UVar4 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    uVar12 = (ulong)ms->nextToUpdate;
    pBVar10 = pBVar6 + uVar12;
    while (pBVar10 + 2 <= (BYTE *)((long)end - 8U)) {
      local_58 = (int)pBVar6;
      lVar14 = 0;
      uVar13 = uVar12;
      do {
        if (lVar14 == 3) break;
        if (0x20 < UVar4) goto LAB_001652ae;
        plVar1 = (long *)(pBVar10 + lVar14);
        switch(uVar2) {
        case 5:
          uVar11 = *plVar1 * -0x30e4432345000000;
          goto LAB_00165200;
        case 6:
          sVar8 = ZSTD_hash6Ptr(plVar1,UVar4);
          break;
        case 7:
          uVar11 = *plVar1 * -0x30e44323405a9d00;
LAB_00165200:
          sVar8 = uVar11 >> (0x40U - (char)UVar4 & 0x3f);
          break;
        case 8:
          sVar8 = ZSTD_hash8Ptr(plVar1,UVar4);
          break;
        default:
          sVar8 = (size_t)((uint)((int)*plVar1 * -0x61c8864f) >> (0x20U - (char)UVar4 & 0x1f));
        }
        if (0x20 < h) goto LAB_001652ae;
        sVar9 = ZSTD_hash8Ptr(plVar1,h);
        if (lVar14 == 0) {
          pUVar5[sVar8] = (int)pBVar10 - local_58;
LAB_0016526e:
          hashTable[sVar9] = (U32)uVar13;
        }
        else if (hashTable[sVar9] == 0) goto LAB_0016526e;
        lVar14 = lVar14 + 1;
        uVar13 = (ulong)((U32)uVar13 + 1);
      } while (dtlm != ZSTD_dtlm_fast);
      uVar12 = (ulong)((int)uVar12 + 3);
      pBVar10 = pBVar10 + 3;
    }
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillDoubleHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillDoubleHashTableForCCtx(ms, end, dtlm);
    }
}